

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

int side3_6d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar34;
  undefined1 auVar33 [16];
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  undefined1 auVar49 [16];
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar56;
  double dVar57;
  undefined1 auVar55 [16];
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  undefined1 auVar65 [16];
  double dVar66;
  
  dVar47 = p0[2];
  dVar35 = p1[2] - dVar47;
  dVar51 = p0[3];
  dVar8 = p1[3] - dVar51;
  dVar62 = p0[4];
  dVar3 = p1[4] - dVar62;
  dVar54 = p0[5];
  dVar40 = p1[5] - dVar54;
  dVar5 = *p0;
  dVar32 = p0[1];
  dVar44 = *p1 - dVar5;
  dVar43 = p1[1] - dVar32;
  dVar37 = ABS(dVar35);
  if (ABS(dVar35) <= ABS(dVar44)) {
    dVar37 = ABS(dVar44);
  }
  dVar4 = ABS(dVar43);
  if (ABS(dVar43) <= dVar37) {
    dVar4 = dVar37;
  }
  dVar37 = ABS(dVar8);
  if (ABS(dVar8) <= dVar4) {
    dVar37 = dVar4;
  }
  dVar4 = ABS(dVar3);
  if (ABS(dVar3) <= dVar37) {
    dVar4 = dVar37;
  }
  dVar9 = *q0 - dVar5;
  dVar18 = q0[1] - dVar32;
  dVar37 = ABS(dVar40);
  if (ABS(dVar40) <= dVar4) {
    dVar37 = dVar4;
  }
  dVar4 = ABS(dVar18);
  if (ABS(dVar18) <= ABS(dVar9)) {
    dVar4 = ABS(dVar9);
  }
  dVar10 = q0[2] - dVar47;
  dVar24 = ABS(dVar10);
  if (ABS(dVar10) <= dVar4) {
    dVar24 = dVar4;
  }
  dVar19 = q0[3] - dVar51;
  dVar4 = ABS(dVar19);
  if (ABS(dVar19) <= dVar24) {
    dVar4 = dVar24;
  }
  dVar11 = q0[4] - dVar62;
  dVar24 = ABS(dVar11);
  if (ABS(dVar11) <= dVar4) {
    dVar24 = dVar4;
  }
  dVar20 = q0[5] - dVar54;
  dVar4 = ABS(dVar20);
  if (ABS(dVar20) <= dVar24) {
    dVar4 = dVar24;
  }
  dVar12 = *q1 - dVar5;
  dVar24 = ABS(dVar12);
  if (ABS(dVar12) <= dVar4) {
    dVar24 = dVar4;
  }
  dVar21 = q1[1] - dVar32;
  dVar4 = ABS(dVar21);
  if (ABS(dVar21) <= dVar24) {
    dVar4 = dVar24;
  }
  dVar13 = q1[2] - dVar47;
  dVar24 = ABS(dVar13);
  if (ABS(dVar13) <= dVar4) {
    dVar24 = dVar4;
  }
  dVar22 = q1[3] - dVar51;
  dVar4 = ABS(dVar22);
  if (ABS(dVar22) <= dVar24) {
    dVar4 = dVar24;
  }
  dVar14 = q1[4] - dVar62;
  dVar24 = ABS(dVar14);
  if (ABS(dVar14) <= dVar4) {
    dVar24 = dVar4;
  }
  dVar38 = q1[5] - dVar54;
  dVar4 = ABS(dVar38);
  if (ABS(dVar38) <= dVar24) {
    dVar4 = dVar24;
  }
  dVar28 = *q2 - dVar5;
  dVar24 = ABS(dVar28);
  if (ABS(dVar28) <= dVar4) {
    dVar24 = dVar4;
  }
  dVar23 = *p2 - dVar5;
  auVar25._0_8_ = ABS(dVar23);
  auVar25._8_8_ = dVar24;
  dVar61 = p2[1] - dVar32;
  dVar63 = q2[1] - dVar32;
  auVar16._0_8_ = ABS(dVar61);
  auVar16._8_8_ = ABS(dVar63);
  auVar16 = maxpd(auVar16,auVar25);
  dVar52 = p2[2] - dVar47;
  dVar56 = q2[2] - dVar47;
  auVar26._0_8_ = ABS(dVar52);
  auVar26._8_8_ = ABS(dVar56);
  auVar16 = maxpd(auVar26,auVar16);
  dVar53 = p2[4] - dVar62;
  dVar57 = q2[4] - dVar62;
  dVar30 = p2[5] - dVar54;
  dVar34 = q2[5] - dVar54;
  dVar15 = p2[3] - dVar51;
  dVar59 = q2[3] - dVar51;
  auVar55._0_8_ = ABS(dVar15);
  auVar55._8_8_ = ABS(dVar59);
  auVar16 = maxpd(auVar55,auVar16);
  auVar27._0_8_ = ABS(dVar53);
  auVar27._8_8_ = ABS(dVar57);
  auVar16 = maxpd(auVar27,auVar16);
  auVar65._0_8_ = ABS(dVar30);
  auVar65._8_8_ = ABS(dVar34);
  auVar16 = maxpd(auVar65,auVar16);
  dVar64 = auVar16._0_8_;
  dVar66 = auVar16._8_8_;
  dVar4 = dVar64;
  dVar24 = dVar37;
  if ((dVar37 <= dVar64) && (dVar4 = dVar37, dVar37 < dVar64)) {
    dVar24 = dVar64;
  }
  dVar29 = dVar66;
  if ((dVar4 <= dVar66) && (dVar29 = dVar4, dVar24 < dVar66)) {
    dVar24 = dVar66;
  }
  iVar1 = 0;
  iVar2 = 0;
  if ((1.4995850219305951e-74 <= dVar29) && (iVar2 = iVar1, dVar24 <= 1.2980742146337065e+33)) {
    dVar39 = dVar40 * dVar20 +
             dVar3 * dVar11 + dVar8 * dVar19 + dVar35 * dVar10 + dVar44 * dVar9 + dVar43 * dVar18;
    dVar36 = dVar40 * dVar38 +
             dVar3 * dVar14 + dVar8 * dVar22 + dVar35 * dVar13 + dVar44 * dVar12 + dVar43 * dVar21;
    dVar45 = dVar40 * dVar34 +
             dVar3 * dVar57 + dVar8 * dVar59 + dVar35 * dVar56 + dVar44 * dVar28 + dVar43 * dVar63;
    dVar24 = dVar30 * dVar20 +
             dVar53 * dVar11 + dVar15 * dVar19 + dVar52 * dVar10 + dVar23 * dVar9 + dVar61 * dVar18;
    dVar4 = dVar30 * dVar38 +
            dVar53 * dVar14 + dVar15 * dVar22 + dVar52 * dVar13 + dVar23 * dVar12 + dVar61 * dVar21;
    dVar60 = dVar30 * dVar34 +
             dVar53 * dVar57 + dVar15 * dVar59 + dVar52 * dVar56 + dVar23 * dVar28 + dVar61 * dVar63
    ;
    dVar39 = dVar39 + dVar39;
    dVar36 = dVar36 + dVar36;
    dVar45 = dVar45 + dVar45;
    dVar24 = dVar24 + dVar24;
    dVar4 = dVar4 + dVar4;
    dVar60 = dVar60 + dVar60;
    dVar41 = dVar36 * dVar60 - dVar4 * dVar45;
    dVar46 = dVar45 * dVar24 - dVar60 * dVar39;
    dVar29 = dVar39 * dVar4 - dVar24 * dVar36;
    dVar42 = dVar41 + dVar46 + dVar29;
    dVar31 = dVar37 * dVar66 * dVar64 * dVar66 * 4.400074760265839e-13;
    if (dVar42 <= dVar31) {
      if (-dVar31 <= dVar42) {
        return 0;
      }
      iVar1 = -1;
    }
    else {
      iVar1 = 1;
    }
    dVar5 = *p3 - dVar5;
    dVar32 = p3[1] - dVar32;
    dVar47 = p3[2] - dVar47;
    dVar51 = p3[3] - dVar51;
    dVar62 = p3[4] - dVar62;
    dVar54 = p3[5] - dVar54;
    dVar31 = ABS(dVar32);
    if (ABS(dVar32) <= dVar37) {
      dVar31 = dVar37;
    }
    auVar17._8_8_ = dVar37;
    auVar17._0_8_ = dVar37;
    dVar37 = ABS(dVar47);
    if (ABS(dVar47) <= dVar31) {
      dVar37 = dVar31;
    }
    dVar31 = ABS(dVar5);
    if (ABS(dVar5) <= dVar37) {
      dVar31 = dVar37;
    }
    dVar37 = ABS(dVar51);
    if (ABS(dVar51) <= dVar31) {
      dVar37 = dVar31;
    }
    dVar31 = ABS(dVar62);
    if (ABS(dVar62) <= dVar37) {
      dVar31 = dVar37;
    }
    dVar37 = ABS(dVar54);
    if (ABS(dVar54) <= dVar31) {
      dVar37 = dVar31;
    }
    auVar55 = maxpd(auVar16,auVar17);
    auVar33._8_8_ = dVar37;
    auVar33._0_8_ = dVar66;
    auVar16 = maxpd(auVar33,auVar55);
    dVar58 = auVar55._8_8_;
    auVar49._8_8_ = dVar58;
    auVar49._0_8_ = dVar37;
    auVar16 = maxpd(auVar49,auVar16);
    dVar50 = auVar16._8_8_;
    dVar31 = dVar50;
    if (dVar50 <= auVar16._0_8_) {
      dVar31 = auVar16._0_8_;
    }
    dVar6 = dVar58;
    if (dVar58 <= dVar31) {
      dVar6 = dVar31;
    }
    dVar31 = dVar66;
    if (dVar64 <= dVar66) {
      dVar31 = dVar64;
    }
    dVar48 = dVar6;
    if ((dVar6 < dVar31) || (dVar7 = dVar6, dVar48 = dVar31, dVar6 <= dVar64)) {
      dVar31 = dVar48;
      dVar7 = dVar64;
    }
    dVar48 = dVar37;
    if (dVar31 <= dVar37) {
      dVar48 = dVar31;
    }
    dVar31 = dVar50;
    if (dVar48 <= dVar50) {
      dVar31 = dVar48;
    }
    dVar48 = dVar58;
    if (dVar31 <= dVar58) {
      dVar48 = dVar31;
    }
    if ((3.31864264949884e-50 <= dVar48) && (dVar7 <= 1.2980742146337065e+33)) {
      dVar35 = dVar40 * dVar40 +
               dVar3 * dVar3 + dVar8 * dVar8 + dVar35 * dVar35 + dVar44 * dVar44 + dVar43 * dVar43;
      dVar43 = dVar30 * dVar30 +
               dVar53 * dVar53 +
               dVar15 * dVar15 + dVar52 * dVar52 + dVar23 * dVar23 + dVar61 * dVar61;
      dVar40 = dVar20 * dVar54 +
               dVar11 * dVar62 + dVar19 * dVar51 + dVar10 * dVar47 + dVar9 * dVar5 + dVar18 * dVar32
      ;
      dVar3 = dVar38 * dVar54 +
              dVar14 * dVar62 + dVar22 * dVar51 + dVar13 * dVar47 + dVar12 * dVar5 + dVar21 * dVar32
      ;
      dVar8 = dVar34 * dVar54 +
              dVar57 * dVar62 + dVar59 * dVar51 + dVar56 * dVar47 + dVar28 * dVar5 + dVar63 * dVar32
      ;
      dVar47 = dVar42 * (dVar54 * dVar54 +
                        dVar62 * dVar62 +
                        dVar51 * dVar51 + dVar47 * dVar47 + dVar5 * dVar5 + dVar32 * dVar32) -
               ((dVar29 + (dVar24 - dVar4) * dVar35 + (dVar36 - dVar39) * dVar43) * (dVar8 + dVar8)
               + (dVar46 + (dVar60 - dVar24) * dVar35 + (dVar39 - dVar45) * dVar43) *
                 (dVar3 + dVar3) +
                 (dVar41 + (dVar4 - dVar60) * dVar35 + (dVar45 - dVar36) * dVar43) *
                 (dVar40 + dVar40));
      dVar51 = dVar37 * dVar66 * dVar64 * dVar58 * dVar50 * dVar6 * 1.665641335871132e-11;
      if (dVar47 <= dVar51) {
        if (-dVar51 <= dVar47) {
          return 0;
        }
        iVar2 = -1;
      }
      else {
        iVar2 = 1;
      }
      iVar2 = iVar2 * iVar1;
    }
  }
  return iVar2;
}

Assistant:

inline int side3_6d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double l1;
    l1 = (1 * ((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double l2;
    l2 = (1 * ((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double p3_4_p0_4 = (p3[4] - p0[4]);
    double p3_5_p0_5 = (p3[5] - p0[5]);
    double l3;
    l3 = (1 * ((((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)) + (p3_4_p0_4 * p3_4_p0_4)) + (p3_5_p0_5 * p3_5_p0_5)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double a10;
    a10 = (2 * ((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double a11;
    a11 = (2 * ((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double q2_4_p0_4 = (q2[4] - p0[4]);
    double q2_5_p0_5 = (q2[5] - p0[5]);
    double a12;
    a12 = (2 * ((((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)) + (p1_4_p0_4 * q2_4_p0_4)) + (p1_5_p0_5 * q2_5_p0_5)));
    double a20;
    a20 = (2 * ((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)));
    double a21;
    a21 = (2 * ((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)));
    double a22;
    a22 = (2 * ((((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)) + (p2_4_p0_4 * q2_4_p0_4)) + (p2_5_p0_5 * q2_5_p0_5)));
    double a30;
    a30 = (2 * ((((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)) + (p3_4_p0_4 * q0_4_p0_4)) + (p3_5_p0_5 * q0_5_p0_5)));
    double a31;
    a31 = (2 * ((((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)) + (p3_4_p0_4 * q1_4_p0_4)) + (p3_5_p0_5 * q1_5_p0_5)));
    double a32;
    a32 = (2 * ((((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)) + (p3_4_p0_4 * q2_4_p0_4)) + (p3_5_p0_5 * q2_5_p0_5)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p1_0_p0_0);
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_4_p0_4)) )
    {
        max1 = fabs(p1_4_p0_4);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    double max2 = fabs(p2_0_p0_0);
    if( (max2 < fabs(p2_1_p0_1)) )
    {
        max2 = fabs(p2_1_p0_1);
    } 
    if( (max2 < fabs(p2_2_p0_2)) )
    {
        max2 = fabs(p2_2_p0_2);
    } 
    if( (max2 < fabs(p2_3_p0_3)) )
    {
        max2 = fabs(p2_3_p0_3);
    } 
    if( (max2 < fabs(p2_4_p0_4)) )
    {
        max2 = fabs(p2_4_p0_4);
    } 
    if( (max2 < fabs(p2_5_p0_5)) )
    {
        max2 = fabs(p2_5_p0_5);
    } 
    double max3 = fabs(q0_0_p0_0);
    if( (max3 < fabs(q0_1_p0_1)) )
    {
        max3 = fabs(q0_1_p0_1);
    } 
    if( (max3 < fabs(q0_2_p0_2)) )
    {
        max3 = fabs(q0_2_p0_2);
    } 
    if( (max3 < fabs(q0_3_p0_3)) )
    {
        max3 = fabs(q0_3_p0_3);
    } 
    if( (max3 < fabs(q0_4_p0_4)) )
    {
        max3 = fabs(q0_4_p0_4);
    } 
    if( (max3 < fabs(q0_5_p0_5)) )
    {
        max3 = fabs(q0_5_p0_5);
    } 
    if( (max3 < fabs(q1_0_p0_0)) )
    {
        max3 = fabs(q1_0_p0_0);
    } 
    if( (max3 < fabs(q1_1_p0_1)) )
    {
        max3 = fabs(q1_1_p0_1);
    } 
    if( (max3 < fabs(q1_2_p0_2)) )
    {
        max3 = fabs(q1_2_p0_2);
    } 
    if( (max3 < fabs(q1_3_p0_3)) )
    {
        max3 = fabs(q1_3_p0_3);
    } 
    if( (max3 < fabs(q1_4_p0_4)) )
    {
        max3 = fabs(q1_4_p0_4);
    } 
    if( (max3 < fabs(q1_5_p0_5)) )
    {
        max3 = fabs(q1_5_p0_5);
    } 
    if( (max3 < fabs(q2_0_p0_0)) )
    {
        max3 = fabs(q2_0_p0_0);
    } 
    if( (max3 < fabs(q2_1_p0_1)) )
    {
        max3 = fabs(q2_1_p0_1);
    } 
    if( (max3 < fabs(q2_2_p0_2)) )
    {
        max3 = fabs(q2_2_p0_2);
    } 
    if( (max3 < fabs(q2_3_p0_3)) )
    {
        max3 = fabs(q2_3_p0_3);
    } 
    if( (max3 < fabs(q2_4_p0_4)) )
    {
        max3 = fabs(q2_4_p0_4);
    } 
    if( (max3 < fabs(q2_5_p0_5)) )
    {
        max3 = fabs(q2_5_p0_5);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 1.49958502193059513986e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.40007476026583916019e-13 * (((max1 * max3) * max2) * max3));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4 = max1;
    if( (max4 < max2) )
    {
        max4 = max2;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    double max5 = max1;
    if( (max5 < fabs(p3_1_p0_1)) )
    {
        max5 = fabs(p3_1_p0_1);
    } 
    if( (max5 < fabs(p3_2_p0_2)) )
    {
        max5 = fabs(p3_2_p0_2);
    } 
    if( (max5 < fabs(p3_0_p0_0)) )
    {
        max5 = fabs(p3_0_p0_0);
    } 
    if( (max5 < fabs(p3_3_p0_3)) )
    {
        max5 = fabs(p3_3_p0_3);
    } 
    if( (max5 < fabs(p3_4_p0_4)) )
    {
        max5 = fabs(p3_4_p0_4);
    } 
    if( (max5 < fabs(p3_5_p0_5)) )
    {
        max5 = fabs(p3_5_p0_5);
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    double max6 = max1;
    if( (max6 < max3) )
    {
        max6 = max3;
    } 
    if( (max6 < max5) )
    {
        max6 = max5;
    } 
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    if( (max6 < max7) )
    {
        max6 = max7;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    if( (max4 < max7) )
    {
        max4 = max7;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    if( (lower_bound_1 < 3.31864264949884013629e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.66564133587113197628e-11 * (((((max5 * max3) * max2) * max7) * max6) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}